

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void BoardTest<uttt::IBoard>(void)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  vector<long,_std::allocator<long>_> moves;
  IBoard game;
  param_type local_58;
  vector<long,_std::allocator<long>_> local_50;
  IBoard local_38;
  
  if (BoardTest<uttt::IBoard>()::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&BoardTest<uttt::IBoard>::rd);
      __cxa_atexit(std::random_device::~random_device,&BoardTest<uttt::IBoard>::rd,&__dso_handle);
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::rd);
    }
  }
  if (BoardTest<uttt::IBoard>()::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&BoardTest<uttt::IBoard>()::gen);
    if (iVar1 != 0) {
      uVar3 = std::random_device::_M_getval();
      uVar4 = (ulong)uVar3;
      lVar5 = 1;
      BoardTest<uttt::IBoard>::gen._M_x[0] = uVar4;
      do {
        uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
        BoardTest<uttt::IBoard>::gen._M_x[lVar5] = uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
      BoardTest<uttt::IBoard>::gen._M_p = 0x270;
      __cxa_guard_release(&BoardTest<uttt::IBoard>()::gen);
    }
  }
  uttt::IBoard::IBoard(&local_38);
  uttt::IBoard::Print(&local_38);
  while( true ) {
    iVar1 = uttt::IBoard::GetStatus(&local_38);
    if (iVar1 != -1) break;
    uttt::IBoard::GetPossibleMoves(&local_50,&local_38);
    local_58._M_b =
         (int)((ulong)((long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) + -1;
    local_58._M_a = 0;
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_58,&BoardTest<uttt::IBoard>::gen,
                       &local_58);
    uttt::IBoard::ApplyMove
              (&local_38,
               local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start + rVar2);
    uttt::IBoard::Print(&local_38);
    if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
BoardTest()
{
    static std::random_device rd;
    static std::mt19937 gen(rd());
    IGame game;
    game.Print();
    std::vector<game::IMove> moves;
    while (game.GetStatus() == game::Undecided)
    {
        auto moves = game.GetPossibleMoves();
        game.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        game.Print();
    }
}